

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O1

type cm::operator!=(char **l,String *r)

{
  char *__s;
  int iVar1;
  size_t __n;
  type tVar2;
  
  __s = *l;
  __n = strlen(__s);
  tVar2 = true;
  if (__n == (r->view_)._M_len) {
    if (__n == 0) {
      tVar2 = false;
    }
    else {
      iVar1 = bcmp(__s,(r->view_)._M_str,__n);
      tVar2 = iVar1 != 0;
    }
  }
  return tVar2;
}

Assistant:

typename std::enable_if<IsComparable<L>::value, bool>::type operator!=(
  L&& l, const String& r)
{
  return AsStringView<L>::view(std::forward<L>(l)) != r.view();
}